

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O0

void __thiscall
HawkTracer::parser::ProtocolReader::ProtocolReader
          (ProtocolReader *this,KlassRegister *klass_register,
          unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
          *stream,bool flat_events)

{
  anon_class_8_1_8991fb9c local_50;
  OnNewEventCallback local_48;
  byte local_21;
  unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
  *puStack_20;
  bool flat_events_local;
  unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
  *stream_local;
  KlassRegister *klass_register_local;
  ProtocolReader *this_local;
  
  this->_klass_register = klass_register;
  local_21 = flat_events;
  puStack_20 = stream;
  stream_local = (unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
                  *)klass_register;
  klass_register_local = (KlassRegister *)this;
  std::
  vector<std::function<void_(const_HawkTracer::parser::Event_&)>,_std::allocator<std::function<void_(const_HawkTracer::parser::Event_&)>_>_>
  ::vector(&this->_on_new_event_callbacks);
  std::unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>::
  unique_ptr(&this->_stream,stream);
  std::thread::thread(&this->_thread);
  std::condition_variable::condition_variable(&this->_cv);
  std::mutex::mutex(&this->_mtx_cv);
  this->_flat_events = (bool)(local_21 & 1);
  this->_endianness = HT_ENDIANNESS_LITTLE;
  local_50.this = this;
  std::function<void(HawkTracer::parser::Event_const&)>::
  function<HawkTracer::parser::ProtocolReader::ProtocolReader(HawkTracer::parser::KlassRegister*,std::unique_ptr<HawkTracer::parser::Stream,std::default_delete<HawkTracer::parser::Stream>>,bool)::__0,void>
            ((function<void(HawkTracer::parser::Event_const&)> *)&local_48,&local_50);
  register_events_listener(this,&local_48);
  std::function<void_(const_HawkTracer::parser::Event_&)>::~function(&local_48);
  return;
}

Assistant:

ProtocolReader::ProtocolReader(KlassRegister* klass_register, std::unique_ptr<Stream> stream, bool flat_events) :
    _klass_register(klass_register),
    _stream(std::move(stream)),
    _flat_events(flat_events)
{
    register_events_listener([this] (const Event& event) {
        _klass_register->handle_register_events(event);
    });
}